

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *buffer,size_t size,
          size_t chunkSize,CrtAllocator *baseAllocator)

{
  SharedData *pSVar1;
  ChunkHeader *pCVar2;
  CrtAllocator *baseAllocator_local;
  size_t chunkSize_local;
  size_t size_local;
  void *buffer_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  this->chunk_capacity_ = chunkSize;
  this->baseAllocator_ = baseAllocator;
  chunkSize_local = size;
  size_local = (size_t)buffer;
  buffer_local = this;
  pSVar1 = (SharedData *)AlignBuffer(buffer,&chunkSize_local);
  this->shared_ = pSVar1;
  if (0x37 < chunkSize_local) {
    pCVar2 = GetChunkHead(this->shared_);
    this->shared_->chunkHead = pCVar2;
    this->shared_->chunkHead->capacity = chunkSize_local - 0x38;
    this->shared_->chunkHead->size = 0;
    this->shared_->chunkHead->next = (ChunkHeader *)0x0;
    this->shared_->ownBaseAllocator = (CrtAllocator *)0x0;
    this->shared_->ownBuffer = false;
    this->shared_->refcount = 1;
    return;
  }
  __assert_fail("size >= SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/allocators.h"
                ,0xce,
                "rapidjson::MemoryPoolAllocator<>::MemoryPoolAllocator(void *, size_t, size_t, BaseAllocator *) [BaseAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

MemoryPoolAllocator(void *buffer, size_t size, size_t chunkSize = kDefaultChunkCapacity, BaseAllocator* baseAllocator = 0) :
        chunk_capacity_(chunkSize),
        baseAllocator_(baseAllocator),
        shared_(static_cast<SharedData*>(AlignBuffer(buffer, size)))
    {
        RAPIDJSON_ASSERT(size >= SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER);
        shared_->chunkHead = GetChunkHead(shared_);
        shared_->chunkHead->capacity = size - SIZEOF_SHARED_DATA - SIZEOF_CHUNK_HEADER;
        shared_->chunkHead->size = 0;
        shared_->chunkHead->next = 0;
        shared_->ownBaseAllocator = 0;
        shared_->ownBuffer = false;
        shared_->refcount = 1;
    }